

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectAppearance.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::ObjectAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,ObjectAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Object Appearance:\n");
  poVar1 = std::operator<<(poVar1,"\tGeneral Appearance:");
  poVar1 = std::operator<<(poVar1,"\tPercent Complete:  ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(ushort)(this->m_GeneralAppearanceUnion).m_ui8GeneralAppearance[0]);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tDamage:            ");
  ENUMS::GetEnumAsStringObjectDamage_abi_cxx11_
            (&local_1c0,
             (ENUMS *)(ulong)((this->m_GeneralAppearanceUnion).m_ui8GeneralAppearance[1] & 3),Value)
  ;
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tPredistributed:    ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance >> 10 & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tState:             ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance >> 0xb & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSmoking:           ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance >> 0xc & 1);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tFlaming:           ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->m_GeneralAppearanceUnion).m_ui16GeneralAppearance >> 0xd & 1);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString ObjectAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Object Appearance:\n"
       << "\tGeneral Appearance:"
       << "\tPercent Complete:  " << m_GeneralAppearanceUnion.m_ui16PcComp         << "\n"
       << "\tDamage:            " << GetEnumAsStringObjectDamage( m_GeneralAppearanceUnion.m_ui16Dmg ) << "\n"
       << "\tPredistributed:    " << m_GeneralAppearanceUnion.m_ui16Predistributed << "\n"
       << "\tState:             " << m_GeneralAppearanceUnion.m_ui16State          << "\n"
       << "\tSmoking:           " << m_GeneralAppearanceUnion.m_ui16Smoking        << "\n"
       << "\tFlaming:           " << m_GeneralAppearanceUnion.m_ui16Flaming        << "\n";

    return ss.str();
}